

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void idct16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i alVar13;
  __m256i alVar14;
  __m256i alVar15;
  __m256i alVar16;
  __m256i alVar17;
  __m256i alVar18;
  undefined1 auVar19 [32];
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar23 = (long)bit * 0x100;
  iVar22 = *(int *)((long)vert_filter_length_chroma + lVar23 + 0x170);
  iVar28 = -iVar22;
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar23 + 0x1f0);
  iVar25 = -iVar21;
  iVar24 = *(int *)((long)vert_filter_length_chroma + lVar23 + 0x1b0);
  iVar26 = -iVar24;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar23 + 0x230);
  iVar27 = 1 << ((char)bit - 1U & 0x1f);
  iVar20 = -iVar2;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar23 + 0x250);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  auVar47._4_4_ = iVar28;
  auVar47._0_4_ = iVar28;
  auVar47._8_4_ = iVar28;
  auVar47._12_4_ = iVar28;
  auVar47._16_4_ = iVar28;
  auVar47._20_4_ = iVar28;
  auVar47._24_4_ = iVar28;
  auVar47._28_4_ = iVar28;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar23 + 0x1d0);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  auVar31._4_4_ = iVar25;
  auVar31._0_4_ = iVar25;
  auVar31._8_4_ = iVar25;
  auVar31._12_4_ = iVar25;
  auVar31._16_4_ = iVar25;
  auVar31._20_4_ = iVar25;
  auVar31._24_4_ = iVar25;
  auVar31._28_4_ = iVar25;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar23 + 0x210);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar51._16_4_ = uVar1;
  auVar51._20_4_ = uVar1;
  auVar51._24_4_ = uVar1;
  auVar51._28_4_ = uVar1;
  auVar56._4_4_ = iVar26;
  auVar56._0_4_ = iVar26;
  auVar56._8_4_ = iVar26;
  auVar56._12_4_ = iVar26;
  auVar56._16_4_ = iVar26;
  auVar56._20_4_ = iVar26;
  auVar56._24_4_ = iVar26;
  auVar56._28_4_ = iVar26;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar23 + 400);
  auVar53._4_4_ = uVar1;
  auVar53._0_4_ = uVar1;
  auVar53._8_4_ = uVar1;
  auVar53._12_4_ = uVar1;
  auVar53._16_4_ = uVar1;
  auVar53._20_4_ = uVar1;
  auVar53._24_4_ = uVar1;
  auVar53._28_4_ = uVar1;
  auVar45._4_4_ = iVar20;
  auVar45._0_4_ = iVar20;
  auVar45._8_4_ = iVar20;
  auVar45._12_4_ = iVar20;
  auVar45._16_4_ = iVar20;
  auVar45._20_4_ = iVar20;
  auVar45._24_4_ = iVar20;
  auVar45._28_4_ = iVar20;
  auVar29._4_4_ = iVar27;
  auVar29._0_4_ = iVar27;
  auVar29._8_4_ = iVar27;
  auVar29._12_4_ = iVar27;
  auVar29._16_4_ = iVar27;
  auVar29._20_4_ = iVar27;
  auVar29._24_4_ = iVar27;
  auVar29._28_4_ = iVar27;
  auVar19 = vpmulld_avx2((undefined1  [32])in[1],auVar34);
  auVar47 = vpmulld_avx2((undefined1  [32])in[0xf],auVar47);
  auVar19 = vpaddd_avx2(auVar19,auVar29);
  auVar19 = vpaddd_avx2(auVar19,auVar47);
  auVar47 = vpmulld_avx2((undefined1  [32])in[9],auVar39);
  auVar31 = vpmulld_avx2((undefined1  [32])in[7],auVar31);
  auVar47 = vpaddd_avx2(auVar47,auVar29);
  auVar47 = vpaddd_avx2(auVar47,auVar31);
  auVar31 = vpmulld_avx2((undefined1  [32])in[5],auVar51);
  auVar56 = vpmulld_avx2((undefined1  [32])in[0xb],auVar56);
  auVar31 = vpaddd_avx2(auVar31,auVar29);
  auVar31 = vpaddd_avx2(auVar31,auVar56);
  auVar45 = vpmulld_avx2((undefined1  [32])in[3],auVar45);
  auVar56 = vpmulld_avx2((undefined1  [32])in[0xd],auVar53);
  auVar56 = vpaddd_avx2(auVar56,auVar29);
  auVar56 = vpaddd_avx2(auVar56,auVar45);
  auVar48._4_4_ = iVar2;
  auVar48._0_4_ = iVar2;
  auVar48._8_4_ = iVar2;
  auVar48._12_4_ = iVar2;
  auVar48._16_4_ = iVar2;
  auVar48._20_4_ = iVar2;
  auVar48._24_4_ = iVar2;
  auVar48._28_4_ = iVar2;
  auVar45 = vpmulld_avx2((undefined1  [32])in[0xd],auVar48);
  auVar32 = vpmulld_avx2((undefined1  [32])in[3],auVar53);
  auVar45 = vpaddd_avx2(auVar45,auVar29);
  auVar45 = vpaddd_avx2(auVar45,auVar32);
  auVar32._4_4_ = iVar24;
  auVar32._0_4_ = iVar24;
  auVar32._8_4_ = iVar24;
  auVar32._12_4_ = iVar24;
  auVar32._16_4_ = iVar24;
  auVar32._20_4_ = iVar24;
  auVar32._24_4_ = iVar24;
  auVar32._28_4_ = iVar24;
  auVar32 = vpmulld_avx2((undefined1  [32])in[5],auVar32);
  auVar48 = vpmulld_avx2((undefined1  [32])in[0xb],auVar51);
  iVar24 = *(int *)((long)vert_filter_length_chroma + lVar23 + 0x180);
  iVar20 = -iVar24;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar23 + 0x200);
  auVar32 = vpaddd_avx2(auVar32,auVar29);
  auVar32 = vpaddd_avx2(auVar48,auVar32);
  iVar25 = -iVar2;
  auVar49._4_4_ = iVar21;
  auVar49._0_4_ = iVar21;
  auVar49._8_4_ = iVar21;
  auVar49._12_4_ = iVar21;
  auVar49._16_4_ = iVar21;
  auVar49._20_4_ = iVar21;
  auVar49._24_4_ = iVar21;
  auVar49._28_4_ = iVar21;
  auVar48 = vpmulld_avx2((undefined1  [32])in[9],auVar49);
  auVar55._4_4_ = iVar22;
  auVar55._0_4_ = iVar22;
  auVar55._8_4_ = iVar22;
  auVar55._12_4_ = iVar22;
  auVar55._16_4_ = iVar22;
  auVar55._20_4_ = iVar22;
  auVar55._24_4_ = iVar22;
  auVar55._28_4_ = iVar22;
  auVar39 = vpmulld_avx2((undefined1  [32])in[7],auVar39);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar23 + 0x240);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar54._16_4_ = uVar1;
  auVar54._20_4_ = uVar1;
  auVar54._24_4_ = uVar1;
  auVar54._28_4_ = uVar1;
  auVar48 = vpaddd_avx2(auVar48,auVar29);
  auVar48 = vpaddd_avx2(auVar48,auVar39);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar23 + 0x1c0);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  auVar35._4_4_ = iVar20;
  auVar35._0_4_ = iVar20;
  auVar35._8_4_ = iVar20;
  auVar35._12_4_ = iVar20;
  auVar35._16_4_ = iVar20;
  auVar35._20_4_ = iVar20;
  auVar35._24_4_ = iVar20;
  auVar35._28_4_ = iVar20;
  auVar50._4_4_ = iVar25;
  auVar50._0_4_ = iVar25;
  auVar50._8_4_ = iVar25;
  auVar50._12_4_ = iVar25;
  auVar50._16_4_ = iVar25;
  auVar50._20_4_ = iVar25;
  auVar50._24_4_ = iVar25;
  auVar50._28_4_ = iVar25;
  auVar39 = vpmulld_avx2((undefined1  [32])in[1],auVar55);
  auVar34 = vpmulld_avx2((undefined1  [32])in[0xf],auVar34);
  auVar39 = vpaddd_avx2(auVar39,auVar29);
  auVar39 = vpaddd_avx2(auVar34,auVar39);
  auVar34 = vpmulld_avx2((undefined1  [32])in[2],auVar54);
  auVar35 = vpmulld_avx2((undefined1  [32])in[0xe],auVar35);
  auVar34 = vpaddd_avx2(auVar34,auVar29);
  auVar34 = vpaddd_avx2(auVar34,auVar35);
  auVar43 = vpmulld_avx2((undefined1  [32])in[6],auVar50);
  auVar35 = vpmulld_avx2((undefined1  [32])in[10],auVar40);
  auVar35 = vpaddd_avx2(auVar35,auVar29);
  auVar35 = vpaddd_avx2(auVar35,auVar43);
  auVar43._4_4_ = iVar2;
  auVar43._0_4_ = iVar2;
  auVar43._8_4_ = iVar2;
  auVar43._12_4_ = iVar2;
  auVar43._16_4_ = iVar2;
  auVar43._20_4_ = iVar2;
  auVar43._24_4_ = iVar2;
  auVar43._28_4_ = iVar2;
  auVar43 = vpmulld_avx2((undefined1  [32])in[10],auVar43);
  auVar40 = vpmulld_avx2((undefined1  [32])in[6],auVar40);
  auVar43 = vpaddd_avx2(auVar43,auVar29);
  auVar43 = vpaddd_avx2(auVar43,auVar40);
  auVar41._4_4_ = iVar24;
  auVar41._0_4_ = iVar24;
  auVar41._8_4_ = iVar24;
  auVar41._12_4_ = iVar24;
  auVar41._16_4_ = iVar24;
  auVar41._20_4_ = iVar24;
  auVar41._24_4_ = iVar24;
  auVar41._28_4_ = iVar24;
  auVar40 = vpmulld_avx2((undefined1  [32])in[2],auVar41);
  auVar41 = vpsrad_avx2(auVar19,ZEXT416((uint)bit));
  auVar49 = vpsrad_avx2(auVar47,ZEXT416((uint)bit));
  auVar38 = ZEXT416((uint)bit);
  auVar50 = vpsrad_avx2(auVar31,auVar38);
  auVar56 = vpsrad_avx2(auVar56,auVar38);
  auVar45 = vpsrad_avx2(auVar45,auVar38);
  auVar32 = vpsrad_avx2(auVar32,auVar38);
  auVar38 = ZEXT416((uint)bit);
  auVar48 = vpsrad_avx2(auVar48,auVar38);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar23 + 0x1e0);
  auVar36._4_4_ = uVar1;
  auVar36._0_4_ = uVar1;
  auVar36._8_4_ = uVar1;
  auVar36._12_4_ = uVar1;
  auVar36._16_4_ = uVar1;
  auVar36._20_4_ = uVar1;
  auVar36._24_4_ = uVar1;
  auVar36._28_4_ = uVar1;
  auVar47 = vpmulld_avx2((undefined1  [32])in[0xe],auVar54);
  auVar39 = vpsrad_avx2(auVar39,auVar38);
  auVar19 = vpaddd_avx2(auVar40,auVar29);
  auVar19 = vpaddd_avx2(auVar47,auVar19);
  auVar47 = vpaddd_avx2(auVar41,auVar49);
  auVar41 = vpsubd_avx2(auVar41,auVar49);
  auVar31 = vpaddd_avx2(auVar56,auVar50);
  auVar49 = vpsubd_avx2(auVar56,auVar50);
  auVar56 = vpaddd_avx2(auVar32,auVar45);
  auVar50 = vpsubd_avx2(auVar45,auVar32);
  auVar45 = vpaddd_avx2(auVar39,auVar48);
  auVar51 = vpsubd_avx2(auVar39,auVar48);
  auVar32 = vpmulld_avx2(auVar36,(undefined1  [32])*in);
  auVar32 = vpaddd_avx2(auVar32,auVar29);
  auVar39 = vpmulld_avx2(auVar36,(undefined1  [32])in[8]);
  auVar48 = vpaddd_avx2(auVar32,auVar39);
  auVar53 = vpsubd_avx2(auVar32,auVar39);
  iVar22 = *(int *)((long)vert_filter_length_chroma + lVar23 + 0x220);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar23 + 0x1a0);
  iVar24 = -iVar21;
  auVar42._4_4_ = iVar22;
  auVar42._0_4_ = iVar22;
  auVar42._8_4_ = iVar22;
  auVar42._12_4_ = iVar22;
  auVar42._16_4_ = iVar22;
  auVar42._20_4_ = iVar22;
  auVar42._24_4_ = iVar22;
  auVar42._28_4_ = iVar22;
  auVar44._4_4_ = iVar24;
  auVar44._0_4_ = iVar24;
  auVar44._8_4_ = iVar24;
  auVar44._12_4_ = iVar24;
  auVar44._16_4_ = iVar24;
  auVar44._20_4_ = iVar24;
  auVar44._24_4_ = iVar24;
  auVar44._28_4_ = iVar24;
  auVar32 = vpmulld_avx2((undefined1  [32])in[4],auVar42);
  auVar32 = vpaddd_avx2(auVar32,auVar29);
  auVar39 = vpmulld_avx2((undefined1  [32])in[0xc],auVar44);
  auVar32 = vpaddd_avx2(auVar39,auVar32);
  auVar46._4_4_ = iVar21;
  auVar46._0_4_ = iVar21;
  auVar46._8_4_ = iVar21;
  auVar46._12_4_ = iVar21;
  auVar46._16_4_ = iVar21;
  auVar46._20_4_ = iVar21;
  auVar46._24_4_ = iVar21;
  auVar46._28_4_ = iVar21;
  auVar39 = vpmulld_avx2((undefined1  [32])in[4],auVar46);
  auVar40 = vpmulld_avx2((undefined1  [32])in[0xc],auVar42);
  auVar39 = vpaddd_avx2(auVar39,auVar29);
  auVar39 = vpaddd_avx2(auVar39,auVar40);
  auVar40 = vpsrad_avx2(auVar34,auVar38);
  auVar35 = vpsrad_avx2(auVar35,auVar38);
  auVar34 = vpaddd_avx2(auVar35,auVar40);
  auVar40 = vpsubd_avx2(auVar40,auVar35);
  auVar35 = vpsrad_avx2(auVar43,auVar38);
  auVar43 = vpsrad_avx2(auVar19,auVar38);
  auVar19 = vpaddd_avx2(auVar43,auVar35);
  auVar35 = vpsubd_avx2(auVar43,auVar35);
  iVar22 = -iVar22;
  iVar24 = bd + (uint)(do_cols == 0) * 2;
  iVar21 = 0x8000;
  if (0xf < iVar24 + 6) {
    iVar21 = 1 << ((char)iVar24 + 5U & 0x1f);
  }
  iVar24 = -iVar21;
  iVar21 = iVar21 + -1;
  auVar37._4_4_ = iVar24;
  auVar37._0_4_ = iVar24;
  auVar37._8_4_ = iVar24;
  auVar37._12_4_ = iVar24;
  auVar37._16_4_ = iVar24;
  auVar37._20_4_ = iVar24;
  auVar37._24_4_ = iVar24;
  auVar37._28_4_ = iVar24;
  auVar33._4_4_ = iVar21;
  auVar33._0_4_ = iVar21;
  auVar33._8_4_ = iVar21;
  auVar33._12_4_ = iVar21;
  auVar33._16_4_ = iVar21;
  auVar33._20_4_ = iVar21;
  auVar33._24_4_ = iVar21;
  auVar33._28_4_ = iVar21;
  auVar43 = vpmaxsd_avx2(auVar41,auVar37);
  auVar54 = vpminsd_avx2(auVar43,auVar33);
  auVar43 = vpmaxsd_avx2(auVar51,auVar37);
  auVar51 = vpminsd_avx2(auVar43,auVar33);
  auVar43 = vpmulld_avx2(auVar54,auVar44);
  auVar43 = vpaddd_avx2(auVar43,auVar29);
  auVar41 = vpmulld_avx2(auVar51,auVar42);
  auVar43 = vpaddd_avx2(auVar43,auVar41);
  auVar52._4_4_ = iVar22;
  auVar52._0_4_ = iVar22;
  auVar52._8_4_ = iVar22;
  auVar52._12_4_ = iVar22;
  auVar52._16_4_ = iVar22;
  auVar52._20_4_ = iVar22;
  auVar52._24_4_ = iVar22;
  auVar52._28_4_ = iVar22;
  auVar41 = vpmaxsd_avx2(auVar37,auVar49);
  auVar49 = vpminsd_avx2(auVar41,auVar33);
  auVar41 = vpmaxsd_avx2(auVar37,auVar50);
  auVar50 = vpminsd_avx2(auVar41,auVar33);
  auVar41 = vpmulld_avx2(auVar49,auVar52);
  auVar41 = vpaddd_avx2(auVar41,auVar29);
  auVar55 = vpmulld_avx2(auVar50,auVar44);
  auVar41 = vpaddd_avx2(auVar41,auVar55);
  auVar49 = vpmulld_avx2(auVar49,auVar44);
  auVar50 = vpmulld_avx2(auVar50,auVar42);
  auVar49 = vpaddd_avx2(auVar49,auVar29);
  auVar49 = vpaddd_avx2(auVar50,auVar49);
  auVar50 = vpmulld_avx2(auVar54,auVar42);
  auVar42 = vpsrad_avx2(auVar48,auVar38);
  auVar51 = vpmulld_avx2(auVar51,auVar46);
  auVar53 = vpsrad_avx2(auVar53,auVar38);
  auVar48 = vpaddd_avx2(auVar50,auVar29);
  auVar48 = vpaddd_avx2(auVar48,auVar51);
  auVar38 = ZEXT416((uint)bit);
  auVar50 = vpsrad_avx2(auVar39,auVar38);
  auVar39 = vpaddd_avx2(auVar50,auVar42);
  auVar51 = vpsubd_avx2(auVar42,auVar50);
  auVar50 = vpsrad_avx2(auVar32,auVar38);
  auVar32 = vpaddd_avx2(auVar53,auVar50);
  auVar53 = vpsubd_avx2(auVar53,auVar50);
  auVar40 = vpmaxsd_avx2(auVar37,auVar40);
  auVar40 = vpminsd_avx2(auVar40,auVar33);
  auVar35 = vpmaxsd_avx2(auVar35,auVar37);
  auVar35 = vpminsd_avx2(auVar35,auVar33);
  auVar40 = vpmulld_avx2(auVar40,auVar36);
  auVar50 = vpmulld_avx2(auVar35,auVar36);
  auVar35 = vpsubd_avx2(auVar29,auVar40);
  auVar35 = vpaddd_avx2(auVar35,auVar50);
  auVar40 = vpaddd_avx2(auVar40,auVar29);
  auVar40 = vpaddd_avx2(auVar40,auVar50);
  auVar47 = vpmaxsd_avx2(auVar37,auVar47);
  auVar50 = vpminsd_avx2(auVar47,auVar33);
  auVar47 = vpmaxsd_avx2(auVar37,auVar31);
  auVar43 = vpsrad_avx2(auVar43,auVar38);
  auVar31 = vpminsd_avx2(auVar47,auVar33);
  auVar41 = vpsrad_avx2(auVar41,auVar38);
  auVar47 = vpaddd_avx2(auVar31,auVar50);
  auVar50 = vpsubd_avx2(auVar50,auVar31);
  auVar31 = vpaddd_avx2(auVar41,auVar43);
  auVar42 = vpsubd_avx2(auVar43,auVar41);
  auVar56 = vpmaxsd_avx2(auVar37,auVar56);
  auVar43 = vpminsd_avx2(auVar56,auVar33);
  auVar56 = vpmaxsd_avx2(auVar37,auVar45);
  auVar41 = vpsrad_avx2(auVar49,auVar38);
  auVar45 = vpminsd_avx2(auVar56,auVar33);
  auVar48 = vpsrad_avx2(auVar48,auVar38);
  auVar56 = vpaddd_avx2(auVar45,auVar43);
  auVar49 = vpsubd_avx2(auVar45,auVar43);
  auVar45 = vpaddd_avx2(auVar48,auVar41);
  auVar43 = vpsubd_avx2(auVar48,auVar41);
  auVar19 = vpmaxsd_avx2(auVar37,auVar19);
  auVar48 = vpminsd_avx2(auVar19,auVar33);
  auVar19 = vpmaxsd_avx2(auVar39,auVar37);
  auVar39 = vpminsd_avx2(auVar19,auVar33);
  auVar19 = vpaddd_avx2(auVar39,auVar48);
  auVar44 = vpsubd_avx2(auVar39,auVar48);
  auVar32 = vpmaxsd_avx2(auVar32,auVar37);
  auVar39 = vpsrad_avx2(auVar40,auVar38);
  auVar48 = vpminsd_avx2(auVar32,auVar33);
  auVar32 = vpaddd_avx2(auVar39,auVar48);
  auVar46 = vpsubd_avx2(auVar48,auVar39);
  auVar48 = vpmaxsd_avx2(auVar37,auVar53);
  auVar39 = vpminsd_avx2(auVar48,auVar33);
  auVar35 = vpsrad_avx2(auVar35,auVar38);
  auVar48 = vpaddd_avx2(auVar35,auVar39);
  auVar53 = vpsubd_avx2(auVar39,auVar35);
  auVar39 = vpmaxsd_avx2(auVar37,auVar34);
  auVar34 = vpminsd_avx2(auVar39,auVar33);
  auVar39 = vpmaxsd_avx2(auVar37,auVar51);
  auVar35 = vpminsd_avx2(auVar39,auVar33);
  auVar39 = vpaddd_avx2(auVar35,auVar34);
  auVar51 = vpsubd_avx2(auVar35,auVar34);
  auVar34 = vpmaxsd_avx2(auVar42,auVar37);
  auVar35 = vpminsd_avx2(auVar34,auVar33);
  auVar34 = vpmaxsd_avx2(auVar43,auVar37);
  auVar34 = vpminsd_avx2(auVar34,auVar33);
  auVar35 = vpmulld_avx2(auVar35,auVar36);
  auVar43 = vpmulld_avx2(auVar34,auVar36);
  auVar34 = vpsubd_avx2(auVar29,auVar35);
  auVar34 = vpaddd_avx2(auVar34,auVar43);
  auVar35 = vpaddd_avx2(auVar35,auVar29);
  auVar35 = vpaddd_avx2(auVar35,auVar43);
  auVar43 = vpmaxsd_avx2(auVar37,auVar50);
  auVar40 = vpminsd_avx2(auVar43,auVar33);
  auVar43 = vpmaxsd_avx2(auVar49,auVar37);
  auVar43 = vpminsd_avx2(auVar43,auVar33);
  auVar41 = vpsrad_avx2(auVar34,auVar38);
  auVar34 = vpmulld_avx2(auVar40,auVar36);
  auVar43 = vpmulld_avx2(auVar43,auVar36);
  auVar40 = vpsrad_avx2(auVar35,auVar38);
  auVar35 = vpsubd_avx2(auVar29,auVar34);
  auVar34 = vpaddd_avx2(auVar34,auVar29);
  auVar35 = vpaddd_avx2(auVar35,auVar43);
  auVar35 = vpsrad_avx2(auVar35,auVar38);
  auVar34 = vpaddd_avx2(auVar34,auVar43);
  auVar43 = vpsrad_avx2(auVar34,auVar38);
  auVar56 = vpmaxsd_avx2(auVar37,auVar56);
  auVar56 = vpminsd_avx2(auVar56,auVar33);
  auVar19 = vpmaxsd_avx2(auVar19,auVar37);
  auVar34 = vpminsd_avx2(auVar19,auVar33);
  auVar19 = vpaddd_avx2(auVar34,auVar56);
  auVar49 = vpsubd_avx2(auVar34,auVar56);
  auVar56 = vpmaxsd_avx2(auVar37,auVar45);
  auVar45 = vpminsd_avx2(auVar56,auVar33);
  auVar56 = vpmaxsd_avx2(auVar32,auVar37);
  auVar32 = vpminsd_avx2(auVar56,auVar33);
  auVar56 = vpaddd_avx2(auVar32,auVar45);
  auVar50 = vpsubd_avx2(auVar32,auVar45);
  auVar45 = vpmaxsd_avx2(auVar48,auVar37);
  auVar32 = vpminsd_avx2(auVar45,auVar33);
  auVar45 = vpaddd_avx2(auVar40,auVar32);
  auVar40 = vpsubd_avx2(auVar32,auVar40);
  auVar32 = vpmaxsd_avx2(auVar39,auVar37);
  auVar48 = vpminsd_avx2(auVar32,auVar33);
  auVar32 = vpaddd_avx2(auVar43,auVar48);
  auVar29 = vpsubd_avx2(auVar48,auVar43);
  auVar48 = vpmaxsd_avx2(auVar51,auVar37);
  auVar39 = vpminsd_avx2(auVar48,auVar33);
  auVar48 = vpaddd_avx2(auVar35,auVar39);
  auVar51 = vpsubd_avx2(auVar39,auVar35);
  auVar39 = vpmaxsd_avx2(auVar53,auVar37);
  auVar34 = vpminsd_avx2(auVar39,auVar33);
  auVar39 = vpaddd_avx2(auVar34,auVar41);
  auVar53 = vpsubd_avx2(auVar34,auVar41);
  auVar31 = vpmaxsd_avx2(auVar37,auVar31);
  auVar34 = vpminsd_avx2(auVar31,auVar33);
  auVar31 = vpmaxsd_avx2(auVar37,auVar46);
  auVar35 = vpminsd_avx2(auVar31,auVar33);
  auVar31 = vpaddd_avx2(auVar35,auVar34);
  auVar36 = vpsubd_avx2(auVar35,auVar34);
  auVar47 = vpmaxsd_avx2(auVar37,auVar47);
  auVar34 = vpminsd_avx2(auVar47,auVar33);
  auVar47 = vpmaxsd_avx2(auVar37,auVar44);
  auVar35 = vpminsd_avx2(auVar47,auVar33);
  auVar47 = vpaddd_avx2(auVar35,auVar34);
  auVar42 = vpsubd_avx2(auVar35,auVar34);
  auVar19 = vpmaxsd_avx2(auVar19,auVar37);
  auVar34 = vpmaxsd_avx2(auVar49,auVar37);
  auVar56 = vpmaxsd_avx2(auVar37,auVar56);
  auVar35 = vpmaxsd_avx2(auVar37,auVar50);
  auVar45 = vpmaxsd_avx2(auVar45,auVar37);
  auVar43 = vpmaxsd_avx2(auVar40,auVar37);
  auVar32 = vpmaxsd_avx2(auVar37,auVar32);
  auVar40 = vpmaxsd_avx2(auVar29,auVar37);
  auVar48 = vpmaxsd_avx2(auVar48,auVar37);
  auVar41 = vpmaxsd_avx2(auVar37,auVar51);
  auVar39 = vpmaxsd_avx2(auVar37,auVar39);
  auVar49 = vpmaxsd_avx2(auVar53,auVar37);
  auVar31 = vpmaxsd_avx2(auVar37,auVar31);
  auVar50 = vpmaxsd_avx2(auVar37,auVar36);
  auVar47 = vpmaxsd_avx2(auVar47,auVar37);
  auVar51 = vpmaxsd_avx2(auVar42,auVar37);
  alVar3 = (__m256i)vpminsd_avx2(auVar19,auVar33);
  alVar4 = (__m256i)vpminsd_avx2(auVar34,auVar33);
  alVar5 = (__m256i)vpminsd_avx2(auVar56,auVar33);
  alVar6 = (__m256i)vpminsd_avx2(auVar35,auVar33);
  alVar7 = (__m256i)vpminsd_avx2(auVar45,auVar33);
  alVar8 = (__m256i)vpminsd_avx2(auVar43,auVar33);
  alVar9 = (__m256i)vpminsd_avx2(auVar32,auVar33);
  alVar10 = (__m256i)vpminsd_avx2(auVar40,auVar33);
  alVar11 = (__m256i)vpminsd_avx2(auVar48,auVar33);
  alVar12 = (__m256i)vpminsd_avx2(auVar41,auVar33);
  alVar13 = (__m256i)vpminsd_avx2(auVar33,auVar39);
  alVar14 = (__m256i)vpminsd_avx2(auVar33,auVar49);
  alVar15 = (__m256i)vpminsd_avx2(auVar33,auVar31);
  alVar16 = (__m256i)vpminsd_avx2(auVar33,auVar50);
  alVar17 = (__m256i)vpminsd_avx2(auVar33,auVar47);
  alVar18 = (__m256i)vpminsd_avx2(auVar51,auVar33);
  *out = alVar3;
  out[0xf] = alVar4;
  out[1] = alVar5;
  out[0xe] = alVar6;
  out[2] = alVar7;
  out[0xd] = alVar8;
  out[3] = alVar9;
  out[0xc] = alVar10;
  out[4] = alVar11;
  out[0xb] = alVar12;
  out[5] = alVar13;
  out[10] = alVar14;
  out[6] = alVar15;
  out[9] = alVar16;
  out[7] = alVar17;
  out[8] = alVar18;
  if (do_cols == 0) {
    iVar22 = 10;
    if (10 < bd) {
      iVar22 = bd;
    }
    local_a0 = 0x20 << ((byte)iVar22 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    if (out_shift != 0) {
      iVar22 = 1 << ((char)out_shift - 1U & 0x1f);
      auVar30._4_4_ = iVar22;
      auVar30._0_4_ = iVar22;
      auVar30._8_4_ = iVar22;
      auVar30._12_4_ = iVar22;
      auVar30._16_4_ = iVar22;
      auVar30._20_4_ = iVar22;
      auVar30._24_4_ = iVar22;
      auVar30._28_4_ = iVar22;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar3,auVar30);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,ZEXT416((uint)out_shift));
      *out = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar5,auVar30);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,ZEXT416((uint)out_shift));
      out[1] = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar7,auVar30);
      auVar38 = ZEXT416((uint)out_shift);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar38);
      out[2] = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar9,auVar30);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar38);
      out[3] = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar11,auVar30);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar38);
      out[4] = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar13,auVar30);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar38);
      out[5] = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar15,auVar30);
      auVar38 = ZEXT416((uint)out_shift);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar38);
      out[6] = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar17,auVar30);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar38);
      out[7] = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar18,auVar30);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar38);
      out[8] = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar16,auVar30);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar38);
      out[9] = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar14,auVar30);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar38);
      out[10] = alVar3;
      auVar19 = vpaddd_avx2(auVar30,(undefined1  [32])alVar12);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar38);
      out[0xb] = alVar3;
      auVar19 = vpaddd_avx2((undefined1  [32])alVar10,auVar30);
      auVar47 = vpaddd_avx2(auVar30,(undefined1  [32])alVar8);
      auVar31 = vpaddd_avx2(auVar30,(undefined1  [32])alVar6);
      auVar56 = vpaddd_avx2(auVar30,(undefined1  [32])alVar4);
      alVar3 = (__m256i)vpsrad_avx2(auVar19,auVar38);
      alVar4 = (__m256i)vpsrad_avx2(auVar47,auVar38);
      out[0xc] = alVar3;
      out[0xd] = alVar4;
      alVar3 = (__m256i)vpsrad_avx2(auVar31,ZEXT416((uint)out_shift));
      out[0xe] = alVar3;
      alVar3 = (__m256i)vpsrad_avx2(auVar56,ZEXT416((uint)out_shift));
      out[0xf] = alVar3;
    }
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_80,(__m256i *)&local_a0,0x10);
  }
  return;
}

Assistant:

static void idct16_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  __m256i cospi_p60_m04 = pair_set_w16_epi16(cospi[60], -cospi[4]);
  __m256i cospi_p04_p60 = pair_set_w16_epi16(cospi[4], cospi[60]);
  __m256i cospi_p28_m36 = pair_set_w16_epi16(cospi[28], -cospi[36]);
  __m256i cospi_p36_p28 = pair_set_w16_epi16(cospi[36], cospi[28]);
  __m256i cospi_p44_m20 = pair_set_w16_epi16(cospi[44], -cospi[20]);
  __m256i cospi_p20_p44 = pair_set_w16_epi16(cospi[20], cospi[44]);
  __m256i cospi_p12_m52 = pair_set_w16_epi16(cospi[12], -cospi[52]);
  __m256i cospi_p52_p12 = pair_set_w16_epi16(cospi[52], cospi[12]);
  __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  __m256i cospi_p24_m40 = pair_set_w16_epi16(cospi[24], -cospi[40]);
  __m256i cospi_p40_p24 = pair_set_w16_epi16(cospi[40], cospi[24]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);
  __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);

  // stage 1
  __m256i x1[16];
  x1[0] = input[0];
  x1[1] = input[8];
  x1[2] = input[4];
  x1[3] = input[12];
  x1[4] = input[2];
  x1[5] = input[10];
  x1[6] = input[6];
  x1[7] = input[14];
  x1[8] = input[1];
  x1[9] = input[9];
  x1[10] = input[5];
  x1[11] = input[13];
  x1[12] = input[3];
  x1[13] = input[11];
  x1[14] = input[7];
  x1[15] = input[15];

  // stage 2
  btf_16_w16_avx2(cospi_p60_m04, cospi_p04_p60, &x1[8], &x1[15], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p28_m36, cospi_p36_p28, &x1[9], &x1[14], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p44_m20, cospi_p20_p44, &x1[10], &x1[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p12_m52, cospi_p52_p12, &x1[11], &x1[12], _r,
                  INV_COS_BIT);

  // stage 3
  btf_16_w16_avx2(cospi_p56_m08, cospi_p08_p56, &x1[4], &x1[7], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p24_m40, cospi_p40_p24, &x1[5], &x1[6], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);

  // stage 4
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p48_m16, cospi_p16_p48, &x1[2], &x1[3], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[9], &x1[14], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[10], &x1[13], _r,
                  INV_COS_BIT);

  idct16_stage5_avx2(x1, cospi, _r, INV_COS_BIT);
  idct16_stage6_avx2(x1, cospi, _r, INV_COS_BIT);
  idct16_stage7_avx2(output, x1);
}